

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void textui_prefs_init(void)

{
  flavor *pfVar1;
  void *pvVar2;
  flavor **ppfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  monster_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->r_max);
  monster_x_char = (wchar_t *)mem_zalloc((ulong)z_info->r_max << 2);
  kind_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->k_max);
  kind_x_char = (wchar_t *)mem_zalloc((ulong)z_info->k_max << 2);
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    pvVar2 = mem_zalloc(0x19);
    *(void **)((long)feat_x_attr + lVar6) = pvVar2;
    pvVar2 = mem_zalloc(100);
    *(void **)((long)feat_x_char + lVar6) = pvVar2;
  }
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    pvVar2 = mem_zalloc((ulong)z_info->trap_max);
    *(void **)((long)trap_x_attr + lVar6) = pvVar2;
    pvVar2 = mem_zalloc((ulong)z_info->trap_max << 2);
    *(void **)((long)trap_x_char + lVar6) = pvVar2;
  }
  ppfVar3 = &flavors;
  uVar5 = flavor_max;
  while (pfVar1 = *ppfVar3, pfVar1 != (flavor *)0x0) {
    uVar4 = (ulong)pfVar1->fidx;
    if (uVar5 < uVar4) {
      uVar5 = uVar4;
      flavor_max = uVar4;
    }
    ppfVar3 = &pfVar1->next;
  }
  flavor_x_attr = (uint8_t *)mem_zalloc(uVar5 + 1);
  flavor_x_char = (wchar_t *)mem_zalloc(flavor_max * 4 + 4);
  reset_visuals(false);
  return;
}

Assistant:

void textui_prefs_init(void)
{
	int i;
	struct flavor *f;

	monster_x_attr = mem_zalloc(z_info->r_max * sizeof(uint8_t));
	monster_x_char = mem_zalloc(z_info->r_max * sizeof(wchar_t));
	kind_x_attr = mem_zalloc(z_info->k_max * sizeof(uint8_t));
	kind_x_char = mem_zalloc(z_info->k_max * sizeof(wchar_t));
	for (i = 0; i < LIGHTING_MAX; i++) {
		feat_x_attr[i] = mem_zalloc(FEAT_MAX * sizeof(uint8_t));
		feat_x_char[i] = mem_zalloc(FEAT_MAX * sizeof(wchar_t));
	}
	for (i = 0; i < LIGHTING_MAX; i++) {
		trap_x_attr[i] = mem_zalloc(z_info->trap_max * sizeof(uint8_t));
		trap_x_char[i] = mem_zalloc(z_info->trap_max * sizeof(wchar_t));
	}
	for (f = flavors; f; f = f->next)
		if (flavor_max < f->fidx)
			flavor_max = f->fidx;
	flavor_x_attr = mem_zalloc((flavor_max + 1) * sizeof(uint8_t));
	flavor_x_char = mem_zalloc((flavor_max + 1) * sizeof(wchar_t));

	reset_visuals(false);
}